

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpGCTest_Collect_InstanceExport_Test::InterpGCTest_Collect_InstanceExport_Test
          (InterpGCTest_Collect_InstanceExport_Test *this)

{
  Features local_1b;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_0023cbe8;
  local_1b.exceptions_enabled_ = false;
  local_1b.mutable_globals_enabled_ = true;
  local_1b.sat_float_to_int_enabled_ = true;
  local_1b.sign_extension_enabled_ = true;
  local_1b.simd_enabled_ = true;
  local_1b.threads_enabled_ = false;
  local_1b.function_references_enabled_ = false;
  local_1b.multi_value_enabled_ = true;
  local_1b.tail_call_enabled_ = false;
  local_1b.bulk_memory_enabled_ = true;
  local_1b.reference_types_enabled_ = true;
  local_1b.annotations_enabled_ = false;
  local_1b.code_metadata_enabled_ = false;
  local_1b.gc_enabled_ = false;
  local_1b.memory64_enabled_ = false;
  local_1b.multi_memory_enabled_ = false;
  local_1b.extended_const_enabled_ = false;
  local_1b.relaxed_simd_enabled_ = false;
  local_1b.custom_page_sizes_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpGCTest).super_InterpTest.store_,&local_1b);
  memset(&(this->super_InterpGCTest).super_InterpTest.module_desc_,0,0x150);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_0023ca48;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_InstanceExport) {
  // (func (export "f"))
  // (global (export "g") i32 (i32.const 0))
  // (table (export "t") 0 funcref)
  // (memory (export "m") 0)
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x04, 0x04, 0x01, 0x70,
      0x00, 0x00, 0x05, 0x03, 0x01, 0x00, 0x00, 0x06, 0x06, 0x01, 0x7f,
      0x00, 0x41, 0x00, 0x0b, 0x07, 0x11, 0x04, 0x01, 0x66, 0x00, 0x00,
      0x01, 0x67, 0x03, 0x00, 0x01, 0x74, 0x01, 0x00, 0x01, 0x6d, 0x02,
      0x00, 0x0a, 0x04, 0x01, 0x02, 0x00, 0x0b,
  });
  Instantiate();
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 7,
            after_new);  // module, instance, f, t, m, g, g-init-func

  // Instance keeps all exports alive, except the init func which can be
  // collected once its has been run
  store_.Collect();
  EXPECT_EQ(after_new - 1, store_.object_count());
}